

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<std::__cxx11::string,std::__cxx11::string>
          (Serializer *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *pair)

{
  (*this->_vptr_Serializer[6])();
  WriteProperty<std::__cxx11::string>(this,0,"first",&pair->first);
  WriteProperty<std::__cxx11::string>(this,1,"second",&pair->second);
  (*this->_vptr_Serializer[7])(this);
  return;
}

Assistant:

void WriteValue(const std::pair<K, V> &pair) {
		OnObjectBegin();
		WriteProperty(0, "first", pair.first);
		WriteProperty(1, "second", pair.second);
		OnObjectEnd();
	}